

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O2

void __thiscall asl::SocketServer::startLoop(SocketServer *this)

{
  uint uVar1;
  undefined4 extraout_var;
  SockClientThread *this_00;
  ulong uVar2;
  Socket client;
  SmartObject local_40;
  Sockets *local_38;
  
  local_38 = &this->_sockets;
  do {
    uVar1 = Sockets::waitInput(local_38,2.0);
    if (0 < (int)uVar1) {
      for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        client.super_SmartObject._p._0_4_ =
             (*((this->_sockets).changed._a[uVar2].super_SmartObject._p)->_vptr_SmartObject_[9])();
        client.super_SmartObject._p._4_4_ = extraout_var;
        if (client.super_SmartObject._p != (SmartObject_ *)0x0) {
          LOCK();
          (((SmartObject_ *)client.super_SmartObject._p)->rc).n =
               (((SmartObject_ *)client.super_SmartObject._p)->rc).n + 1;
          UNLOCK();
        }
        LOCK();
        (this->_numClients).n = (this->_numClients).n + 1;
        UNLOCK();
        if (this->_sequential == true) {
          if (client.super_SmartObject._p != (SmartObject_ *)0x0) {
            LOCK();
            (((SmartObject_ *)client.super_SmartObject._p)->rc).n =
                 (((SmartObject_ *)client.super_SmartObject._p)->rc).n + 1;
            UNLOCK();
          }
          local_40 = client.super_SmartObject._p;
          (**this->_vptr_SocketServer)(this,&local_40);
          SmartObject::~SmartObject(&local_40);
          (**(code **)(*(long *)client.super_SmartObject._p + 0x58))();
          LOCK();
          (this->_numClients).n = (this->_numClients).n + -1;
          UNLOCK();
        }
        else {
          this_00 = (SockClientThread *)operator_new(0x28);
          SockClientThread::SockClientThread(this_00,this,(Socket *)&client.super_SmartObject);
        }
        SmartObject::~SmartObject(&client.super_SmartObject);
      }
    }
  } while ((-1 < (int)uVar1) && (this->_requestStop == false));
  this->_running = false;
  return;
}

Assistant:

void SocketServer::startLoop()
{
	int n;
	do
	{
		if ((n = _sockets.waitInput(2)) > 0)
		{
			for (int i = 0; i < n; i++)
			{
				Socket client = _sockets.activeAt(i).accept();
				++_numClients;
				if (_sequential) {
					serve(client);
					client.close();
					--_numClients;
				}
				else
					new SockClientThread(this, client);
			}
		}
		if(_requestStop || n < 0)
		{
			_running = false;
			break;
		}
		
	}
	while(true);
}